

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svlogd.c
# Opt level: O3

uint ip4_scan(char *s,char *ip)

{
  char in_AL;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  unsigned_long u;
  char local_38 [8];
  
  local_38[0] = in_AL;
  uVar1 = scan_ulong(s,(unsigned_long *)local_38);
  uVar2 = 0;
  uVar5 = 0;
  if (uVar1 != 0) {
    *ip = local_38[0];
    uVar5 = uVar2;
    if (s[uVar1] == '.') {
      pcVar6 = s + (ulong)uVar1 + 1;
      uVar2 = scan_ulong(pcVar6,(unsigned_long *)local_38);
      if (uVar2 != 0) {
        ip[1] = local_38[0];
        if (pcVar6[uVar2] == '.') {
          pcVar6 = pcVar6 + (ulong)uVar2 + 1;
          uVar3 = scan_ulong(pcVar6,(unsigned_long *)local_38);
          if (uVar3 != 0) {
            ip[2] = local_38[0];
            if (pcVar6[uVar3] == '.') {
              uVar4 = scan_ulong(pcVar6 + (ulong)uVar3 + 1,(unsigned_long *)local_38);
              if (uVar4 != 0) {
                ip[3] = local_38[0];
                uVar5 = uVar4 + uVar1 + uVar2 + uVar3 + 3;
              }
            }
          }
        }
      }
    }
  }
  return uVar5;
}

Assistant:

unsigned int ip4_scan(const char *s,char ip[4])
{
  unsigned int i;
  unsigned int len;
  unsigned long u;

  len = 0;
  i = scan_ulong(s,&u); if (!i) return 0; ip[0] = u; s += i; len += i;
  if (*s != '.') return 0; ++s; ++len;
  i = scan_ulong(s,&u); if (!i) return 0; ip[1] = u; s += i; len += i;
  if (*s != '.') return 0; ++s; ++len;
  i = scan_ulong(s,&u); if (!i) return 0; ip[2] = u; s += i; len += i;
  if (*s != '.') return 0; ++s; ++len;
  i = scan_ulong(s,&u); if (!i) return 0; ip[3] = u; s += i; len += i;
  return len;
}